

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O2

int CloseFiles(Context *context,int success)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  char *__format;
  FILE *pFVar5;
  uint uVar6;
  bool bVar7;
  utimbuf local_c8;
  stat statbuf;
  
  uVar6 = 1;
  if ((context->test_integrity != 0) || (pFVar5 = (FILE *)context->fout, pFVar5 == (FILE *)0x0))
  goto LAB_00103864;
  if ((success == 0) && (context->current_output_path != (char *)0x0)) {
    unlink(context->current_output_path);
    pFVar5 = (FILE *)context->fout;
  }
  iVar1 = fclose(pFVar5);
  pFVar5 = _stderr;
  if (iVar1 == 0 || success == 0) {
    if (success == 0 || iVar1 != 0) {
      uVar6 = (uint)(iVar1 == 0);
      goto LAB_00103864;
    }
    if (context->copy_stat == 0) goto LAB_00103864;
    pcVar4 = context->current_output_path;
    if (pcVar4 == (char *)0x0 || context->current_input_path == (char *)0x0) goto LAB_00103864;
    iVar1 = stat(context->current_input_path,(stat *)&statbuf);
    if (iVar1 != 0) goto LAB_00103864;
    local_c8.actime = statbuf.st_atim.tv_sec;
    local_c8.modtime = statbuf.st_mtim.tv_sec;
    utime(pcVar4,&local_c8);
    iVar1 = chmod(pcVar4,statbuf.st_mode & 0x1ff);
    pFVar5 = _stderr;
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(pFVar5,"setting access bits failed for [%s]: %s\n",pcVar4,pcVar3);
    }
    iVar1 = chown(pcVar4,0xffffffff,statbuf.st_gid);
    pFVar5 = _stderr;
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(pFVar5,"setting group failed for [%s]: %s\n",pcVar4,pcVar3);
    }
    iVar1 = chown(pcVar4,statbuf.st_uid,0xffffffff);
    pFVar5 = _stderr;
    if (iVar1 == 0) goto LAB_00103864;
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    __format = "setting user failed for [%s]: %s\n";
  }
  else {
    pcVar4 = "con";
    if (context->current_output_path != (char *)0x0) {
      pcVar4 = context->current_output_path;
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    __format = "fclose failed [%s]: %s\n";
    uVar6 = 0;
  }
  fprintf(pFVar5,__format,pcVar4,pcVar3);
LAB_00103864:
  if ((FILE *)context->fin != (FILE *)0x0) {
    iVar1 = fclose((FILE *)context->fin);
    pFVar5 = _stderr;
    if ((iVar1 != 0) && (bVar7 = uVar6 != 0, uVar6 = 0, bVar7)) {
      pcVar4 = "con";
      if (context->current_input_path != (char *)0x0) {
        pcVar4 = context->current_input_path;
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      uVar6 = 0;
      fprintf(pFVar5,"fclose failed [%s]: %s\n",pcVar4,pcVar3);
    }
  }
  if (((success != 0) && (context->junk_source != 0)) &&
     (context->current_input_path != (char *)0x0)) {
    unlink(context->current_input_path);
  }
  context->fin = (FILE *)0x0;
  context->fout = (FILE *)0x0;
  return uVar6;
}

Assistant:

static BROTLI_BOOL CloseFiles(Context* context, BROTLI_BOOL success) {
  BROTLI_BOOL is_ok = BROTLI_TRUE;
  if (!context->test_integrity && context->fout) {
    if (!success && context->current_output_path) {
      unlink(context->current_output_path);
    }
    if (fclose(context->fout) != 0) {
      if (success) {
        fprintf(stderr, "fclose failed [%s]: %s\n",
                PrintablePath(context->current_output_path), strerror(errno));
      }
      is_ok = BROTLI_FALSE;
    }

    /* TOCTOU violation, but otherwise it is impossible to set file times. */
    if (success && is_ok && context->copy_stat) {
      CopyStat(context->current_input_path, context->current_output_path);
    }
  }

  if (context->fin) {
    if (fclose(context->fin) != 0) {
      if (is_ok) {
        fprintf(stderr, "fclose failed [%s]: %s\n",
                PrintablePath(context->current_input_path), strerror(errno));
      }
      is_ok = BROTLI_FALSE;
    }
  }
  if (success && context->junk_source && context->current_input_path) {
    unlink(context->current_input_path);
  }

  context->fin = NULL;
  context->fout = NULL;

  return is_ok;
}